

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool __thiscall
ON_Extrusion::GetBrepFormComponentIndex
          (ON_Extrusion *this,ON_COMPONENT_INDEX extrusion_ci,double extrusion_profile_parameter,
          ON_Brep *brep,bool bSmoothFaces,ON_COMPONENT_INDEX *brep_ci,ON_Interval *profile_subdomain
          )

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int extrusion_profile_index;
  int iVar4;
  ON_Curve *pOVar5;
  int local_a0;
  bool local_99;
  int local_98;
  int local_94;
  int side_count;
  bool bCountProfileDiscontinuities;
  int brep_face_count;
  int cap_count;
  int edges_per_wall_face;
  bool bClosedProfile;
  ON_Curve *profile0;
  int profile_count;
  int is_capped;
  ON_Interval face_profile_domain;
  int face_index;
  ON_Interval *profile_subdomain_local;
  ON_COMPONENT_INDEX *brep_ci_local;
  bool bSmoothFaces_local;
  ON_Brep *brep_local;
  double extrusion_profile_parameter_local;
  ON_Extrusion *this_local;
  int iStack_10;
  ON_COMPONENT_INDEX extrusion_ci_local;
  
  ON_COMPONENT_INDEX::UnSet(brep_ci);
  face_profile_domain.m_t[1]._4_4_ = -1;
  ON_Interval::ON_Interval
            ((ON_Interval *)&profile_count,-1.23432101234321e+308,-1.23432101234321e+308);
  iVar3 = IsCapped(this);
  if ((iVar3 < 0) || (3 < iVar3)) {
    extrusion_ci_local.m_type._3_1_ = invalid_type >> 0x18;
  }
  else {
    extrusion_profile_index = ProfileCount(this);
    if (extrusion_profile_index < 1) {
      extrusion_ci_local.m_type._3_1_ = invalid_type >> 0x18;
    }
    else {
      pOVar5 = Profile(this,0);
      if (pOVar5 == (ON_Curve *)0x0) {
        extrusion_ci_local.m_type._3_1_ = invalid_type >> 0x18;
      }
      else {
        iVar4 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
        bVar1 = -(char)iVar4 & 1;
        if ((extrusion_profile_index < 2) || (bVar1 != 0)) {
          if ((iVar3 == 0) || (bVar1 == 0)) {
            local_94 = 0;
          }
          else {
            local_94 = 1;
            if (iVar3 == 3) {
              local_94 = 2;
            }
          }
          if (brep == (ON_Brep *)0x0) {
            local_98 = 0;
          }
          else {
            local_98 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&brep->m_F);
            if (local_98 < extrusion_profile_index + local_94) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_beam.cpp"
                         ,0xcf4,"","brep_form parameter cannot be extrusion\'s BrepForm()");
              return false;
            }
          }
          bVar2 = extrusion_profile_index + local_94 < local_98;
          local_99 = bSmoothFaces || bVar2;
          local_a0 = extrusion_profile_index;
          if (bSmoothFaces || bVar2) {
            local_a0 = GetSmoothSideCount(this);
          }
          this_local._4_4_ = extrusion_ci.m_type;
          iStack_10 = extrusion_ci.m_index;
          switch(this_local._4_4_) {
          case extrusion_bottom_profile:
          case extrusion_top_profile:
            if (((long)extrusion_ci < 0) || (extrusion_profile_index <= iStack_10)) {
              return false;
            }
            bVar2 = GetBrepFormFaceIndex
                              (this,iStack_10,extrusion_profile_parameter,local_99,
                               (int *)((long)face_profile_domain.m_t + 0xc),
                               (ON_Interval *)&profile_count);
            if (!bVar2) {
              return false;
            }
            if (face_profile_domain.m_t[1]._4_4_ < 1) {
              brep_ci->m_index = 0;
            }
            else {
              brep_ci->m_index = (face_profile_domain.m_t[1]._4_4_ + -1) * 3 + 4;
            }
            if (this_local._4_4_ == extrusion_top_profile) {
              if ((bVar1 == 0) || (face_profile_domain.m_t[1]._4_4_ != local_a0 + -1)) {
                brep_ci->m_index = brep_ci->m_index + 2;
              }
              else {
                brep_ci->m_index = brep_ci->m_index + 1;
              }
            }
            brep_ci->m_type = brep_edge;
            if (profile_subdomain != (ON_Interval *)0x0) {
              profile_subdomain->m_t[0] = _profile_count;
              profile_subdomain->m_t[1] = face_profile_domain.m_t[0];
            }
            break;
          case extrusion_wall_edge:
            if (((long)extrusion_ci < 0) ||
               (SBORROW4(iStack_10,extrusion_profile_index * 2) ==
                iStack_10 + extrusion_profile_index * -2 < 0)) {
              return false;
            }
            bVar2 = GetBrepFormFaceIndex
                              (this,iStack_10 / 2,extrusion_profile_parameter,local_99,
                               (int *)((long)face_profile_domain.m_t + 0xc),
                               (ON_Interval *)&profile_count);
            if (!bVar2) {
              return false;
            }
            brep_ci->m_index = face_profile_domain.m_t[1]._4_4_ * 4 + 1;
            if ((bVar1 == 0) && (face_profile_domain.m_t[1]._4_4_ % 1 == 1)) {
              brep_ci->m_index = brep_ci->m_index + 2;
            }
            brep_ci->m_type = brep_edge;
            break;
          case extrusion_wall_surface:
            if (((long)extrusion_ci < 0) || (local_a0 <= iStack_10)) {
              return false;
            }
            bVar2 = GetBrepFormFaceIndex
                              (this,iStack_10,extrusion_profile_parameter,local_99,
                               (int *)((long)face_profile_domain.m_t + 0xc),
                               (ON_Interval *)&profile_count);
            if (!bVar2) {
              return false;
            }
            brep_ci->m_index = face_profile_domain.m_t[1]._4_4_;
            brep_ci->m_type = brep_face;
            if (profile_subdomain != (ON_Interval *)0x0) {
              profile_subdomain->m_t[0] = _profile_count;
              profile_subdomain->m_t[1] = face_profile_domain.m_t[0];
            }
            break;
          case extrusion_cap_surface:
            if (((long)extrusion_ci < 0) || (2 < iStack_10)) {
              return false;
            }
            if (((iStack_10 == 1) && (iVar3 != 1)) && (iVar3 != 3)) {
              return false;
            }
            if (((iStack_10 == 2) && (iVar3 != 2)) && (iVar3 != 3)) {
              return false;
            }
            if (brep == (ON_Brep *)0x0) {
              bVar2 = GetBrepFormFaceIndex
                                (this,extrusion_profile_index,extrusion_profile_parameter,local_99,
                                 (int *)((long)face_profile_domain.m_t + 0xc),
                                 (ON_Interval *)&profile_count);
              if (!bVar2) {
                return false;
              }
            }
            else {
              iVar3 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&brep->m_F);
              face_profile_domain.m_t[1]._4_4_ = iVar3 - local_94;
            }
            brep_ci->m_index = face_profile_domain.m_t[1]._4_4_ + iStack_10 + -1;
            brep_ci->m_type = brep_face;
            break;
          case extrusion_path:
          }
          bVar2 = ON_COMPONENT_INDEX::IsBrepComponentIndex(brep_ci);
          if (bVar2) {
            extrusion_ci_local.m_type._3_1_ = 1;
          }
          else {
            ON_COMPONENT_INDEX::UnSet(brep_ci);
            extrusion_ci_local.m_type._3_1_ = invalid_type >> 0x18;
          }
        }
        else {
          extrusion_ci_local.m_type._3_1_ = invalid_type >> 0x18;
        }
      }
    }
  }
  return (bool)extrusion_ci_local.m_type._3_1_;
}

Assistant:

bool ON_Extrusion::GetBrepFormComponentIndex(
  ON_COMPONENT_INDEX extrusion_ci,
  double extrusion_profile_parameter,
  const ON_Brep* brep,
  bool bSmoothFaces,
  ON_COMPONENT_INDEX& brep_ci,
  ON_Interval* profile_subdomain
) const
{
  brep_ci.UnSet();
  int face_index = -1;
  ON_Interval face_profile_domain(ON_UNSET_VALUE,ON_UNSET_VALUE);

  const int is_capped = IsCapped();
  if ( is_capped < 0 || is_capped > 3 )
    return false;
  const int profile_count = ProfileCount();
  if ( profile_count < 1 )
    return false;
  const ON_Curve* profile0 = Profile(0);
  if ( 0 == profile0 )
    return false;
  const bool bClosedProfile = profile0->IsClosed() ? true : false;
  if ( profile_count > 1 && !bClosedProfile )
    return false;
  const int edges_per_wall_face = 4;
  const int cap_count = (0 == is_capped || !bClosedProfile) ? 0 : ((3==is_capped)?2:1);
  int brep_face_count = ( nullptr != brep ) ? brep->m_F.Count() : 0;
  if ( nullptr != brep && brep_face_count < profile_count + cap_count )
  {
    ON_ERROR("brep_form parameter cannot be extrusion's BrepForm()");
    return false;
  }
  bool bCountProfileDiscontinuities = bSmoothFaces || ( brep_face_count > profile_count + cap_count );
  int side_count = (bCountProfileDiscontinuities) ? GetSmoothSideCount(*this) : profile_count;

  switch(extrusion_ci.m_type)
  {
  case ON_COMPONENT_INDEX::extrusion_bottom_profile:
  case ON_COMPONENT_INDEX::extrusion_top_profile:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index >= profile_count )
      return false;
    if ( !GetBrepFormFaceIndex( *this, extrusion_ci.m_index, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
      return false;

    // first face has edges_per_wall_face edges, the subsequent ones have one less
    if (face_index > 0)
      brep_ci.m_index = edges_per_wall_face + ((edges_per_wall_face-1) * (face_index-1));
    else
      brep_ci.m_index = 0;

    if (ON_COMPONENT_INDEX::extrusion_top_profile == extrusion_ci.m_type)
    {
      if ( bClosedProfile && face_index == side_count - 1)
        brep_ci.m_index += 1; // in closed case the last face has an already existing edge between bottom and top edge
      else
        brep_ci.m_index += 2;
    }
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_edge;
    if (nullptr != profile_subdomain)
      *profile_subdomain = face_profile_domain;
    break;

  case ON_COMPONENT_INDEX::extrusion_wall_edge:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index >= 2*profile_count )
      return false;
    if ( !GetBrepFormFaceIndex( *this, extrusion_ci.m_index/2, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
      return false;
    brep_ci.m_index = edges_per_wall_face*face_index+1;
    if ( !bClosedProfile && 1 == (face_index % 1) )
      brep_ci.m_index += 2;
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_edge;
    break;

  case ON_COMPONENT_INDEX::extrusion_wall_surface:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index >= side_count )
      return false;
    if ( !GetBrepFormFaceIndex( *this, extrusion_ci.m_index, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
      return false;
    brep_ci.m_index = face_index;
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_face;
    if (nullptr != profile_subdomain)
      *profile_subdomain = face_profile_domain;
    break;

  case ON_COMPONENT_INDEX::extrusion_cap_surface:
    if ( extrusion_ci.m_index < 0 || extrusion_ci.m_index > 2 )
      return false;
    if ( 1 == extrusion_ci.m_index && (is_capped != 1 && is_capped != 3) )
      return false;
    if ( 2 == extrusion_ci.m_index && (is_capped != 2 && is_capped != 3) )
      return false;
    if ( 0 != brep )
    {
      face_index = brep->m_F.Count()-cap_count;
    }
    else if ( !GetBrepFormFaceIndex( *this, profile_count, extrusion_profile_parameter, bCountProfileDiscontinuities, &face_index, &face_profile_domain ) )
    {
      return false;
    }

    brep_ci.m_index = face_index+extrusion_ci.m_index-1;
    brep_ci.m_type = ON_COMPONENT_INDEX::brep_face;
    break;

  case ON_COMPONENT_INDEX::extrusion_path:
    // There is no corresponding brep component index
    break;

  default:
    // Other ON_COMPONENT_INDEX::TYPE values intentionally ignored
    break;
  }

  if ( !brep_ci.IsBrepComponentIndex() )
  {
    brep_ci.UnSet();
    return false;
  }

  return true;
}